

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KdTree.cpp
# Opt level: O1

void __thiscall
RVO::KdTree::queryAgentTreeRecursive(KdTree *this,Agent *agent,float *rangeSq,size_t node)

{
  pointer pAVar1;
  size_t node_00;
  size_t *psVar2;
  size_t sVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  
  do {
    pAVar1 = (this->agentTree_).
             super__Vector_base<RVO::KdTree::AgentTreeNode,_std::allocator<RVO::KdTree::AgentTreeNode>_>
             ._M_impl.super__Vector_impl_data._M_start;
    sVar3 = pAVar1[node].begin;
    if (pAVar1[node].end - sVar3 < 0xb) {
      for (; sVar3 < (this->agentTree_).
                     super__Vector_base<RVO::KdTree::AgentTreeNode,_std::allocator<RVO::KdTree::AgentTreeNode>_>
                     ._M_impl.super__Vector_impl_data._M_start[node].end; sVar3 = sVar3 + 1) {
        Agent::insertAgentNeighbor
                  (agent,(this->agents_).
                         super__Vector_base<RVO::Agent_*,_std::allocator<RVO::Agent_*>_>._M_impl.
                         super__Vector_impl_data._M_start[sVar3],rangeSq);
      }
      return;
    }
    sVar3 = pAVar1[node].left;
    node_00 = pAVar1[node].right;
    fVar4 = (agent->position_).x_;
    fVar8 = (agent->position_).y_;
    fVar6 = pAVar1[sVar3].minX - fVar4;
    if (fVar6 <= 0.0) {
      fVar6 = 0.0;
    }
    fVar7 = fVar4 - pAVar1[sVar3].maxX;
    if (fVar7 <= 0.0) {
      fVar7 = 0.0;
    }
    fVar5 = pAVar1[sVar3].minY - fVar8;
    if (fVar5 <= 0.0) {
      fVar5 = 0.0;
    }
    fVar9 = fVar8 - pAVar1[sVar3].maxY;
    if (fVar9 <= 0.0) {
      fVar9 = 0.0;
    }
    fVar7 = fVar9 * fVar9 + fVar5 * fVar5 + fVar7 * fVar7 + fVar6 * fVar6;
    fVar6 = pAVar1[node_00].minX - fVar4;
    if (fVar6 <= 0.0) {
      fVar6 = 0.0;
    }
    fVar4 = fVar4 - pAVar1[node_00].maxX;
    if (fVar4 <= 0.0) {
      fVar4 = 0.0;
    }
    fVar5 = pAVar1[node_00].minY - fVar8;
    if (fVar5 <= 0.0) {
      fVar5 = 0.0;
    }
    fVar8 = fVar8 - pAVar1[node_00].maxY;
    if (fVar8 <= 0.0) {
      fVar8 = 0.0;
    }
    fVar4 = fVar8 * fVar8 + fVar5 * fVar5 + fVar4 * fVar4 + fVar6 * fVar6;
    if (fVar4 <= fVar7) {
      if (*rangeSq <= fVar4) {
        return;
      }
      queryAgentTreeRecursive(this,agent,rangeSq,node_00);
      if (*rangeSq <= fVar7) {
        return;
      }
      psVar2 = &(this->agentTree_).
                super__Vector_base<RVO::KdTree::AgentTreeNode,_std::allocator<RVO::KdTree::AgentTreeNode>_>
                ._M_impl.super__Vector_impl_data._M_start[node].left;
    }
    else {
      if (*rangeSq <= fVar7) {
        return;
      }
      queryAgentTreeRecursive(this,agent,rangeSq,sVar3);
      if (*rangeSq <= fVar4) {
        return;
      }
      psVar2 = &(this->agentTree_).
                super__Vector_base<RVO::KdTree::AgentTreeNode,_std::allocator<RVO::KdTree::AgentTreeNode>_>
                ._M_impl.super__Vector_impl_data._M_start[node].right;
    }
    node = *psVar2;
  } while( true );
}

Assistant:

void KdTree::queryAgentTreeRecursive(Agent *agent, float &rangeSq, size_t node) const
	{
		if (agentTree_[node].end - agentTree_[node].begin <= MAX_LEAF_SIZE) {
			for (size_t i = agentTree_[node].begin; i < agentTree_[node].end; ++i) {
				agent->insertAgentNeighbor(agents_[i], rangeSq);
			}
		}
		else {
			const float distSqLeft = sqr(std::max(0.0f, agentTree_[agentTree_[node].left].minX - agent->position_.x())) + sqr(std::max(0.0f, agent->position_.x() - agentTree_[agentTree_[node].left].maxX)) + sqr(std::max(0.0f, agentTree_[agentTree_[node].left].minY - agent->position_.y())) + sqr(std::max(0.0f, agent->position_.y() - agentTree_[agentTree_[node].left].maxY));

			const float distSqRight = sqr(std::max(0.0f, agentTree_[agentTree_[node].right].minX - agent->position_.x())) + sqr(std::max(0.0f, agent->position_.x() - agentTree_[agentTree_[node].right].maxX)) + sqr(std::max(0.0f, agentTree_[agentTree_[node].right].minY - agent->position_.y())) + sqr(std::max(0.0f, agent->position_.y() - agentTree_[agentTree_[node].right].maxY));

			if (distSqLeft < distSqRight) {
				if (distSqLeft < rangeSq) {
					queryAgentTreeRecursive(agent, rangeSq, agentTree_[node].left);

					if (distSqRight < rangeSq) {
						queryAgentTreeRecursive(agent, rangeSq, agentTree_[node].right);
					}
				}
			}
			else {
				if (distSqRight < rangeSq) {
					queryAgentTreeRecursive(agent, rangeSq, agentTree_[node].right);

					if (distSqLeft < rangeSq) {
						queryAgentTreeRecursive(agent, rangeSq, agentTree_[node].left);
					}
				}
			}

		}
	}